

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O0

void __thiscall
KalmanFilter::Init(KalmanFilter *this,VectorXd *x_in,MatrixXd *P_in,MatrixXd *F_in,MatrixXd *H_in,
                  MatrixXd *R_in,MatrixXd *Q_in)

{
  MatrixXd *R_in_local;
  MatrixXd *H_in_local;
  MatrixXd *F_in_local;
  MatrixXd *P_in_local;
  VectorXd *x_in_local;
  KalmanFilter *this_local;
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->x_,x_in);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->P_,P_in);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->F_,F_in);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->H_,H_in);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->R_,R_in);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->Q_,Q_in);
  return;
}

Assistant:

void KalmanFilter::Init(VectorXd &x_in, MatrixXd &P_in, MatrixXd &F_in,
                        MatrixXd &H_in, MatrixXd &R_in, MatrixXd &Q_in) {
  x_ = x_in;
  P_ = P_in;
  F_ = F_in;
  H_ = H_in;
  R_ = R_in;
  Q_ = Q_in;

}